

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O2

void __thiscall Kernel::Kernel(Kernel *this,int width,int height)

{
  runtime_error *this_00;
  allocator_type local_45;
  value_type_conflict2 local_44;
  _Vector_base<float,_std::allocator<float>_> local_40;
  
  this->width = width;
  this->height = height;
  this->xoff = 0;
  this->yoff = 0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->scale = 1.0;
  if ((((width & 0x80000001U) == 1) && (0 < height)) && ((height & 0x80000001U) == 1)) {
    local_44 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_40,(ulong)(uint)(height * width),
               &local_44,&local_45);
    std::vector<float,_std::allocator<float>_>::_M_move_assign(&this->weights,&local_40);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_40);
    this->yoff = (uint)height >> 1;
    this->xoff = (uint)width >> 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Each kernel dimension must be positive uneven.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Kernel::Kernel(int width, int height) : width(width), height(height) {
  if ((width % 2 != 1) || (height % 2 != 1) || (width < 1) || (height < 1)) {
    throw std::runtime_error("Each kernel dimension must be positive uneven.");
  }
  weights = std::vector<float>((size_t) (width * height), 0.0f);
  yoff = height / 2;
  xoff = width / 2;
}